

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void do_osc(Terminal *term)

{
  Ldisc *ldisc;
  wchar_t wVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  
  if (term->osc_w == true) {
    wVar1 = term->osc_strlen;
    lVar6 = (long)wVar1;
    while( true ) {
      wVar1 = wVar1 + L'\xffffffff';
      term->osc_strlen = wVar1;
      if (lVar6 == 0) break;
      term->wordness[(byte)term->osc_string[lVar6 + -1]] = (short)term->esc_args[0];
      lVar6 = lVar6 + -1;
    }
    return;
  }
  pcVar4 = term->osc_string;
  term->osc_string[term->osc_strlen] = '\0';
  uVar2 = term->esc_args[0];
  if (uVar2 < 2) {
    if (term->no_remote_wintitle == false) {
      safefree(term->icon_title);
      pcVar3 = dupstr(pcVar4);
      term->icon_title = pcVar3;
      term->icontitle_codepage = term->ucsdata->line_codepage;
      term->win_icon_title_pending = true;
      term_schedule_update(term);
      uVar2 = term->esc_args[0];
    }
    if (uVar2 == 1) {
      return;
    }
  }
  else if (uVar2 != 2) {
    if (uVar2 == 4) {
      if (term->ldisc == (Ldisc *)0x0) {
        return;
      }
      if (*pcVar4 != '?') {
        return;
      }
      if (term->osc_string[1] != '\0') {
        return;
      }
      uVar7 = (ulong)term->esc_args[1];
      if (0x105 < uVar7) {
        return;
      }
      pcVar4 = dupprintf("\x1b]4;%u;rgb:%04x/%04x/%04x\a",uVar7,
                         (ulong)((uint)term->palette[uVar7].r * 0x101),
                         (ulong)((uint)term->palette[uVar7].g * 0x101),
                         (ulong)((uint)term->palette[uVar7].b * 0x101));
      ldisc = term->ldisc;
      sVar5 = strlen(pcVar4);
      ldisc_send(ldisc,pcVar4,(wchar_t)sVar5,false);
      safefree(pcVar4);
      return;
    }
    if (uVar2 != 0x15) {
      return;
    }
  }
  if (term->no_remote_wintitle != false) {
    return;
  }
  safefree(term->window_title);
  pcVar4 = dupstr(pcVar4);
  term->window_title = pcVar4;
  term->wintitle_codepage = term->ucsdata->line_codepage;
  term->win_title_pending = true;
  term_schedule_update(term);
  return;
}

Assistant:

static void do_osc(Terminal *term)
{
    if (term->osc_w) {
        while (term->osc_strlen--)
            term->wordness[(unsigned char)
                term->osc_string[term->osc_strlen]] = term->esc_args[0];
    } else {
        term->osc_string[term->osc_strlen] = '\0';
        switch (term->esc_args[0]) {
          case 0:
          case 1:
            if (!term->no_remote_wintitle) {
                sfree(term->icon_title);
                term->icon_title = dupstr(term->osc_string);
                term->icontitle_codepage = term->ucsdata->line_codepage;
                term->win_icon_title_pending = true;
                term_schedule_update(term);
            }
            if (term->esc_args[0] == 1)
                break;
            /* fall through: parameter 0 means set both */
          case 2:
          case 21:
            if (!term->no_remote_wintitle) {
                sfree(term->window_title);
                term->window_title = dupstr(term->osc_string);
                term->wintitle_codepage = term->ucsdata->line_codepage;
                term->win_title_pending = true;
                term_schedule_update(term);
            }
            break;
          case 4:
            if (term->ldisc && !strcmp(term->osc_string, "?")) {
                unsigned index = term->esc_args[1];
                if (index < OSC4_NCOLOURS) {
                    rgb colour = term->palette[index];
                    char *reply_buf = dupprintf(
                        "\033]4;%u;rgb:%04x/%04x/%04x\007", index,
                        (unsigned)colour.r * 0x0101,
                        (unsigned)colour.g * 0x0101,
                        (unsigned)colour.b * 0x0101);
                    ldisc_send(term->ldisc, reply_buf, strlen(reply_buf),
                               false);
                    sfree(reply_buf);
                }
            }
            break;
        }
    }
}